

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

void __thiscall
t_dart_generator::generate_service_interface(t_dart_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *out;
  pointer pcVar1;
  long *plVar2;
  ostream *poVar3;
  long *plVar4;
  pointer pptVar5;
  t_dart_generator *this_00;
  string class_name;
  string extends_iface;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  string local_128;
  char *local_108;
  long local_100;
  char local_f8 [16];
  vector<t_function_*,_std::allocator<t_function_*>_> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  if (tservice->extends_ != (t_service *)0x0) {
    get_ttype_class_name_abi_cxx11_(&local_128,this,&tservice->extends_->super_t_type);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x395650);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_138 = *plVar4;
      lStack_130 = plVar2[3];
      local_148 = &local_138;
    }
    else {
      local_138 = *plVar4;
      local_148 = (long *)*plVar2;
    }
    local_140 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_148);
    if (local_148 != &local_138) {
      operator_delete(local_148);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
  }
  out = &this->f_service_;
  generate_dart_doc(this,(ostream *)out,(t_doc *)tservice);
  local_148 = &local_138;
  pcVar1 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar1,
             pcVar1 + (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
            );
  this_00 = (t_dart_generator *)
            (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,this_00,
             (long)&(this_00->super_t_oop_generator).super_t_generator._vptr_t_generator +
             (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length);
  get_file_name(&local_50,this_00,&local_70);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_148,(long)local_148 + local_140);
  export_class_to_library(this,&local_50,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"abstract class ",0xf);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_148,local_140);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_108,local_100);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," ","");
  scope_up(this,(ostream *)out,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_e8,&tservice->functions_);
  if (local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar5 = local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      generate_dart_doc(this,(ostream *)out,*pptVar5);
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)out);
      function_signature_abi_cxx11_(&local_128,this,*pptVar5);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_128._M_dataplus._M_p,local_128._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,endl2_abi_cxx11_._M_dataplus._M_p,
             endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
  scope_down(this,(ostream *)out,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  return;
}

Assistant:

void t_dart_generator::generate_service_interface(t_service* tservice) {
  string extends_iface = "";
  if (tservice->get_extends() != nullptr) {
    extends_iface = " extends " + get_ttype_class_name(tservice->get_extends());
  }

  generate_dart_doc(f_service_, tservice);

  string class_name = service_name_;
  export_class_to_library(get_file_name(service_name_), class_name);
  indent(f_service_) << "abstract class " << class_name << extends_iface;
  scope_up(f_service_);

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << endl;
    generate_dart_doc(f_service_, *f_iter);
    indent(f_service_) << function_signature(*f_iter) << ";" << endl;
  }

  scope_down(f_service_, endl2);
}